

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

void __thiscall
lest::message::message(message *this,text *kind_,location *where_,text *expr_,text *note_)

{
  string local_60 [48];
  text *local_30;
  text *note__local;
  text *expr__local;
  location *where__local;
  text *kind__local;
  message *this_local;
  
  local_30 = note_;
  note__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)kind_;
  kind__local = (text *)this;
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)expr_);
  *(undefined ***)this = &PTR__message_00179700;
  std::__cxx11::string::string((string *)&this->kind,(string *)kind_);
  location::location(&this->where,where_);
  std::__cxx11::string::string(local_60,(string *)note_);
  comment::comment(&this->note,(text *)local_60);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

message( text kind_, location where_, text expr_, text note_ = "" )
    : std::runtime_error( expr_), kind( kind_), where( where_), note( note_) {}